

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O3

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateLoadConstantNDLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  string *layerName;
  bool bVar3;
  LayerUnion LVar4;
  WeightParams *pWVar5;
  long *plVar6;
  unsigned_long *puVar7;
  size_type *psVar8;
  uint uVar9;
  _Alloc_hider _Var10;
  uint64_t expectedUnits;
  int i;
  int index;
  string err;
  Result r;
  undefined1 local_c0 [8];
  _Alloc_hider local_b8;
  undefined1 local_b0 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  string local_50;
  
  Result::Result((Result *)&local_78);
  validateInputCount((Result *)local_c0,layer,0,0);
  local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_c0;
  std::__cxx11::string::operator=((string *)&local_70,(string *)&local_b8);
  bVar3 = Result::good((Result *)&local_78);
  if (local_b8._M_p != local_b0 + 8) {
    operator_delete(local_b8._M_p,local_b0._8_8_ + 1);
  }
  if (bVar3) {
    validateOutputCount((Result *)local_c0,layer,1,1);
    local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_c0;
    std::__cxx11::string::operator=((string *)&local_70,(string *)&local_b8);
    bVar3 = Result::good((Result *)&local_78);
    if (local_b8._M_p != local_b0 + 8) {
      operator_delete(local_b8._M_p,local_b0._8_8_ + 1);
    }
    if (bVar3) {
      if (layer->_oneof_case_[0] == 0x42e) {
        LVar4 = layer->layer_;
      }
      else {
        LVar4.loadconstantnd_ = Specification::LoadConstantNDLayerParams::default_instance();
      }
      pWVar5 = (LVar4.batchnorm_)->variance_;
      if (pWVar5 == (WeightParams *)0x0) {
        pWVar5 = (WeightParams *)&Specification::_WeightParams_default_instance_;
      }
      bVar3 = 0 < (pWVar5->floatvalue_).current_size_;
      uVar9 = bVar3 + 1;
      if (((pWVar5->float16value_).ptr_)->_M_string_length == 0) {
        uVar9 = (uint)bVar3;
      }
      uVar2 = ((LVar4.convolution_)->kernelsize_).current_size_;
      if (1 < ((uVar9 - (((pWVar5->rawvalue_).ptr_)->_M_string_length == 0)) + 2) -
              (uint)(((pWVar5->int8rawvalue_).ptr_)->_M_string_length == 0)) {
        if (uVar2 == 0) {
LAB_002d8ca5:
          std::operator+(&local_98,"Target shape is required parameter for \'",(layer->name_).ptr_);
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_98);
          psVar8 = (size_type *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_b0._0_8_ = *psVar8;
            local_b0._8_8_ = plVar6[3];
            local_c0 = (undefined1  [8])local_b0;
          }
          else {
            local_b0._0_8_ = *psVar8;
            local_c0 = (undefined1  [8])*plVar6;
          }
          local_b8._M_p = (pointer)plVar6[1];
          *plVar6 = (long)psVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_c0);
          local_98.field_2._M_allocated_capacity = local_b0._0_8_;
          _Var10._M_p = (pointer)local_c0;
          if (local_c0 == (undefined1  [8])local_b0) goto LAB_002d8c75;
        }
        else {
          std::operator+(&local_98,"LoadConstantND layer \'",(layer->name_).ptr_);
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_98);
          local_c0 = (undefined1  [8])local_b0;
          psVar8 = (size_type *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_b0._0_8_ = *psVar8;
            local_b0._8_8_ = plVar6[3];
          }
          else {
            local_b0._0_8_ = *psVar8;
            local_c0 = (undefined1  [8])*plVar6;
          }
          local_b8._M_p = (pointer)plVar6[1];
          *plVar6 = (long)psVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_c0);
LAB_002d8e0c:
          if (local_c0 != (undefined1  [8])local_b0) {
            operator_delete((void *)local_c0,local_b0._0_8_ + 1);
          }
          _Var10._M_p = local_98._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p == &local_98.field_2) goto LAB_002d8c75;
        }
        operator_delete(_Var10._M_p,local_98.field_2._M_allocated_capacity + 1);
        goto LAB_002d8c75;
      }
      if (uVar2 == 0) goto LAB_002d8ca5;
      if (5 < uVar2) {
        std::operator+(&local_98,"LoadConstantND layer \'",(layer->name_).ptr_);
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_98);
        local_c0 = (undefined1  [8])local_b0;
        psVar8 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_b0._0_8_ = *psVar8;
          local_b0._8_8_ = plVar6[3];
        }
        else {
          local_b0._0_8_ = *psVar8;
          local_c0 = (undefined1  [8])*plVar6;
        }
        local_b8._M_p = (pointer)plVar6[1];
        *plVar6 = (long)psVar8;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_c0);
        goto LAB_002d8e0c;
      }
      expectedUnits = 1;
      index = 0;
      do {
        puVar7 = google::protobuf::RepeatedField<unsigned_long>::Get
                           (&(LVar4.convolution_)->kernelsize_,index);
        expectedUnits = expectedUnits * *puVar7;
        index = index + 1;
      } while (index < ((LVar4.convolution_)->kernelsize_).current_size_);
      pWVar5 = (LVar4.batchnorm_)->variance_;
      if (pWVar5 == (WeightParams *)0x0) {
        pWVar5 = (WeightParams *)&Specification::_WeightParams_default_instance_;
      }
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"LoadConstantND","");
      layerName = (layer->name_).ptr_;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"constants","");
      validateGeneralWeightParams
                ((Result *)local_c0,pWVar5,expectedUnits,1,&local_98,layerName,&local_50);
      local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_c0;
      std::__cxx11::string::operator=((string *)&local_70,(string *)&local_b8);
      if (local_b8._M_p != local_b0 + 8) {
        operator_delete(local_b8._M_p,local_b0._8_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      bVar3 = Result::good((Result *)&local_78);
      if (bVar3) {
        Result::Result(__return_storage_ptr__);
        goto LAB_002d8c75;
      }
    }
  }
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)__return_storage_ptr__ = local_78;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_p == &local_60) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_60._M_allocated_capacity._1_7_,local_60._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_60._8_8_;
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_70._M_p;
    (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
         CONCAT71(local_60._M_allocated_capacity._1_7_,local_60._M_local_buf[0]);
  }
  (__return_storage_ptr__->m_message)._M_string_length = local_68;
  local_68 = 0;
  local_60._M_local_buf[0] = '\0';
  local_70._M_p = (pointer)&local_60;
LAB_002d8c75:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_p != &local_60) {
    operator_delete(local_70._M_p,
                    CONCAT71(local_60._M_allocated_capacity._1_7_,local_60._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateLoadConstantNDLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    if (!(r = validateInputCount(layer, 0, 0)).good()) return r;
    if (!(r = validateOutputCount(layer, 1, 1)).good()) return r;

    const auto& params = layer.loadconstantnd();
    WeightParamType paramType = valueType(params.data());

    if (params.shape_size() == 0) {
        const std::string err = "Target shape is required parameter for '" + layer.name() + "' layer.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    // Only float32 or float16 parameters can be populated at any time
    if (paramType == UNSPECIFIED) {
        return Result(ResultType::INVALID_MODEL_PARAMETERS,
                      "LoadConstantND layer '" + layer.name() + "' has both full precision and half precision weight fields populated");
    }
    if (!(params.shape_size() >= 1 && params.shape_size() <= 5)) {
        return Result(ResultType::INVALID_MODEL_PARAMETERS,
                      "LoadConstantND layer '" + layer.name() + "'can only accept shape of length 1 to 5");
    }
    size_t total_shape = 1;
    for (int i = 0; i < params.shape_size(); i++) {
        total_shape *= params.shape(i);
    }

    r = validateGeneralWeightParams(params.data(), total_shape, 1, "LoadConstantND", layer.name(), "constants");
    if (!r.good()) return r;

    return Result();
}